

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

bool anon_unknown.dwarf_106655::IsNonLocalValue(VmInstruction *inst)

{
  VmValue **ppVVar1;
  uint i;
  uint index;
  bool bVar2;
  
  index = 0;
  if ((inst->super_VmValue).users.count == 0) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = index < (inst->super_VmValue).users.count;
      if (!bVar2) {
        return bVar2;
      }
      ppVVar1 = SmallArray<VmValue_*,_8U>::operator[](&(inst->super_VmValue).users,index);
      index = index + 1;
    } while (inst->parent == (VmBlock *)(*ppVVar1)[1].users.data);
  }
  return bVar2;
}

Assistant:

bool IsNonLocalValue(VmInstruction *inst)
	{
		if(inst->users.empty())
			return false;

		for(unsigned i = 0; i < inst->users.size(); i++)
		{
			VmInstruction *user = getType<VmInstruction>(inst->users[i]);

			if(inst->parent != user->parent)
				return true;
		}

		return false;
	}